

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::NamedLabelSyntax*&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          NamedLabelSyntax **args_1,Token *args_2,NamedBlockClauseSyntax **args_3,
          SyntaxList<slang::syntax::MemberSyntax> *args_4,Token *args_5,
          NamedBlockClauseSyntax **args_6)

{
  Token begin;
  Token end;
  GenerateBlockSyntax *pGVar1;
  Info *in_RCX;
  SyntaxList<slang::syntax::MemberSyntax> *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  GenerateBlockSyntax *in_R9;
  Info *unaff_retaddr;
  NamedBlockClauseSyntax *in_stack_00000008;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pGVar1 = (GenerateBlockSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  begin.info = in_RCX;
  begin.kind = (short)in_R8;
  begin._2_1_ = (char)((ulong)in_R8 >> 0x10);
  begin.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  begin.rawLen = (int)((ulong)in_R8 >> 0x20);
  end.info = unaff_retaddr;
  end.kind = (short)in_RDI;
  end._2_1_ = (char)((ulong)in_RDI >> 0x10);
  end.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  end.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RCX->location,
             (NamedLabelSyntax *)in_RCX->rawTextPtr,begin,
             (NamedBlockClauseSyntax *)(in_stack_00000008->super_SyntaxNode).parent,in_RSI,end,
             in_stack_00000008);
  return pGVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }